

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

string * wabt::StringPrintf_abi_cxx11_(string *__return_storage_ptr__,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_type __n;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  va_list args;
  undefined8 local_68;
  va_list args_copy;
  vector<char,_std::allocator<char>_> buffer;
  
  args[0].overflow_arg_area = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_88 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  local_68 = 0x3000000010;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_88);
  __n = (size_type)(iVar1 + 1);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&args_copy[0].reg_save_area,__n,
             (allocator_type *)
             ((long)&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  vsnprintf((char *)args_copy[0].reg_save_area,__n,format,&local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,args_copy[0].reg_save_area,
             (long)args_copy[0].reg_save_area + (__n - 1));
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&args_copy[0].reg_save_area);
  return __return_storage_ptr__;
}

Assistant:

StringPrintf(const char* format, ...) {
  va_list args;
  va_list args_copy;
  va_start(args, format);
  va_copy(args_copy, args);
  size_t len = wabt_vsnprintf(nullptr, 0, format, args) + 1;  // For \0.
  std::vector<char> buffer(len);
  va_end(args);
  wabt_vsnprintf(buffer.data(), len, format, args_copy);
  va_end(args_copy);
  return std::string(buffer.data(), len - 1);
}